

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

void __thiscall
CompressedArray::const_iterator::switch_to_block(const_iterator *this,uint32_t block_index)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint in_ESI;
  const_iterator *in_RDI;
  
  sVar2 = std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
          size(&in_RDI->array->headers);
  if (in_ESI < sVar2) {
    in_RDI->block_index = in_ESI;
    pvVar3 = std::
             vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
             operator[](&in_RDI->array->headers,(ulong)in_ESI);
    in_RDI->record_index = pvVar3->record_index;
    pvVar3 = std::
             vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
             operator[](&in_RDI->array->headers,(ulong)in_ESI);
    in_RDI->offset = pvVar3->offset;
    pvVar3 = std::
             vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
             operator[](&in_RDI->array->headers,(ulong)in_ESI);
    (in_RDI->record).key = pvVar3->key;
    read_value(in_RDI);
    bVar1 = read_bit((const_iterator *)0x16b406);
    in_RDI->same_word = bVar1;
  }
  else {
    sVar2 = std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
            ::size(&in_RDI->array->headers);
    in_RDI->block_index = (uint32_t)sVar2;
    in_RDI->record_index = in_RDI->array->record_count;
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)this);
    in_RDI->offset = (uint32_t)sVar2;
  }
  return;
}

Assistant:

void CompressedArray::const_iterator::switch_to_block(uint32_t block_index) {
    if (block_index >= array->headers.size()) {
        this->block_index = uint32_t(array->headers.size());
        record_index = array->record_count;
        offset = uint32_t(array->data.size());
    } else {
        this->block_index = block_index;
        record_index = array->headers[block_index].record_index;
        offset = array->headers[block_index].offset;

        record.key = array->headers[block_index].key;
        read_value();

        same_word = read_bit();
    }
}